

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O2

void __thiscall
TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_>::SetOrder
          (TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_> *this,TPZVec<int> *ord,int type)

{
  int order;
  TPZGaussRule *pTVar1;
  
  if (ord->fNElements < 3) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
                   );
    return;
  }
  TPZPrInteg<TPZPrInteg<TPZInt1Point>_>::SetOrder
            (&this->super_TPZPrInteg<TPZPrInteg<TPZInt1Point>_>,ord,type);
  order = ord->fStore[2];
  this->fOrdKsi = order;
  pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
  this->fIntP = pTVar1;
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }